

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QPoint>>
          (QtPrivate *this,QDebug debug,char *which,QList<QPoint> *c)

{
  QPoint *pQVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  QDebug *pQVar5;
  QPoint *pQVar6;
  QPoint *pQVar7;
  long in_FS_OFFSET;
  QPoint local_60;
  QDebug local_58;
  QPoint local_50;
  QDebug local_48;
  QDebugStateSaver saver;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  pQVar5 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar5,'(');
  pQVar7 = (c->d).ptr;
  lVar3 = (c->d).size;
  pQVar1 = pQVar7 + lVar3;
  if (lVar3 == 0) goto LAB_002d8acb;
  local_50 = *(QPoint *)debug.stream;
  pQVar6 = &local_50;
  *(int *)((long)local_50 + 0x28) = *(int *)((long)local_50 + 0x28) + 1;
  pQVar5 = &local_48;
  while( true ) {
    ::operator<<((QDebug *)pQVar5,pQVar6);
    QDebug::~QDebug(pQVar5);
    QDebug::~QDebug((QDebug *)pQVar6);
    pQVar7 = pQVar7 + 1;
LAB_002d8acb:
    if (pQVar7 == pQVar1) break;
    pQVar6 = (QPoint *)QDebug::operator<<((QDebug *)debug.stream,", ");
    local_60 = *pQVar6;
    pQVar6 = &local_60;
    *(int *)((long)local_60 + 0x28) = *(int *)((long)local_60 + 0x28) + 1;
    pQVar5 = &local_58;
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar4 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar4;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}